

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  path *this;
  filesystem_error *e;
  string local_f0;
  directory_entry *local_d0;
  directory_entry *entry;
  undefined1 local_b8 [8];
  directory_iterator __end1;
  undefined1 local_98 [8];
  directory_iterator __begin1;
  directory_iterator local_60;
  directory_iterator *local_50;
  directory_iterator *__range1;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string dir;
  
  dir.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"/",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&__begin1._M_dir._M_refcount,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_60,(path *)&__begin1._M_dir._M_refcount);
  std::filesystem::__cxx11::path::~path((path *)&__begin1._M_dir._M_refcount);
  local_50 = &local_60;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount,local_50);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_98,(directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&entry,local_50);
  std::filesystem::__cxx11::end((directory_iterator *)local_b8);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)&entry);
  while( true ) {
    bVar1 = std::filesystem::__cxx11::operator!=
                      ((directory_iterator *)local_98,(directory_iterator *)local_b8);
    if (!bVar1) break;
    local_d0 = (directory_entry *)
               std::filesystem::__cxx11::directory_iterator::operator*
                         ((directory_iterator *)local_98);
    poVar2 = std::operator<<((ostream *)&std::cout,"name: ");
    this = std::filesystem::__cxx11::directory_entry::path(local_d0);
    std::filesystem::__cxx11::path::filename((path *)&e,this);
    std::filesystem::__cxx11::path::string(&local_f0,(path *)&e);
    poVar2 = std::operator<<(poVar2,(string *)&local_f0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_f0);
    std::filesystem::__cxx11::path::~path((path *)&e);
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_98);
  }
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_b8);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_98);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_60);
  dir.field_2._12_4_ = 0;
  std::__cxx11::string::~string((string *)local_30);
  return dir.field_2._12_4_;
}

Assistant:

int main() {
    std::string dir = "/";

    try {
        for (const auto& entry : std::filesystem::directory_iterator(dir)) {
            std::cout << "name: " << entry.path().filename().string() << "\n";
        }
    } catch (std::filesystem::filesystem_error& e) {
        std::cout << "An error has occurred: " << e.what() << '\n';
    }

    return 0;
}